

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

VM * newVM(void)

{
  VM *vm_00;
  VM *vm;
  
  vm_00 = (VM *)malloc(0x90);
  if (vm_00 == (VM *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"allocate VM failed!");
  }
  initVM(vm_00);
  buildCore(vm_00);
  return vm_00;
}

Assistant:

VM *newVM() {
    VM *vm = (VM *) malloc(sizeof(VM));
    if (vm == NULL) {
        MEM_ERROR("allocate VM failed!");
    }
    initVM(vm);
    buildCore(vm);
    return vm;
}